

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::RandomMemoryMappingInstance::RandomMemoryMappingInstance
          (RandomMemoryMappingInstance *this,Context *context,deUint32 seed)

{
  bool bVar1;
  int iVar2;
  deBool dVar3;
  size_t sVar4;
  TestContext *this_00;
  Platform *pPVar5;
  undefined4 extraout_var;
  VkPhysicalDevice physicalDevice_00;
  VkPhysicalDeviceProperties *pVVar6;
  ulong __n;
  reference pvVar7;
  MemoryHeap *pMVar8;
  InternalError *this_01;
  pointer local_330;
  undefined1 local_2a0 [8];
  SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap> heap;
  VkMemoryHeap heapInfo;
  deUint32 heapIndex;
  uint local_270;
  allocator<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>_>
  local_269;
  deUint32 memoryTypeNdx;
  vector<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>,_std::allocator<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>_>_>
  memoryTypes;
  VkDeviceSize nonCoherentAtomSize;
  VkPhysicalDeviceMemoryProperties memoryProperties;
  InstanceInterface *vki;
  VkPhysicalDevice physicalDevice;
  deUint32 seed_local;
  Context *context_local;
  RandomMemoryMappingInstance *this_local;
  
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__RandomMemoryMappingInstance_016668b0;
  sVar4 = getMemoryObjectSystemSize(context);
  this->m_memoryObjectSysMemSize = sVar4;
  sVar4 = getMemoryMappingSystemSize();
  this->m_memoryMappingSysMemSize = sVar4;
  this_00 = vkt::Context::getTestContext(context);
  pPVar5 = tcu::TestContext::getPlatform(this_00);
  iVar2 = (*pPVar5->_vptr_Platform[5])();
  ::vk::getMemoryLimits(&this->m_memoryLimits,(Platform *)CONCAT44(extraout_var,iVar2));
  de::Random::Random(&this->m_rng,seed);
  this->m_opNdx = 0;
  TotalMemoryTracker::TotalMemoryTracker(&this->m_totalMemTracker);
  std::
  vector<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>
  ::vector(&this->m_memoryHeaps);
  std::
  vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
  ::vector(&this->m_mappedMemoryObjects);
  std::
  vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
  ::vector(&this->m_nonMappedMemoryObjects);
  std::
  vector<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
  ::vector(&this->m_memoryMappings);
  physicalDevice_00 = vkt::Context::getPhysicalDevice(context);
  memoryProperties.memoryHeaps[0xf]._8_8_ = vkt::Context::getInstanceInterface(context);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&nonCoherentAtomSize,
             (InstanceInterface *)memoryProperties.memoryHeaps[0xf]._8_8_,physicalDevice_00);
  pVVar6 = vkt::Context::getDeviceProperties(context);
  if ((pVVar6->limits).nonCoherentAtomSize == 0) {
    local_330 = (pointer)0x1;
  }
  else {
    pVVar6 = vkt::Context::getDeviceProperties(context);
    local_330 = (pointer)(pVVar6->limits).nonCoherentAtomSize;
  }
  memoryTypes.
  super__Vector_base<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>,_std::allocator<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_330;
  __n = (ulong)memoryProperties.memoryTypes[0x1f].propertyFlags;
  std::
  allocator<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>_>
  ::allocator(&local_269);
  std::
  vector<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>,_std::allocator<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>_>_>
  ::vector((vector<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>,_std::allocator<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>_>_>
            *)&memoryTypeNdx,__n,&local_269);
  std::
  allocator<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>_>
  ::~allocator(&local_269);
  for (local_270 = 0; local_270 < (uint)nonCoherentAtomSize; local_270 = local_270 + 1) {
    if ((memoryProperties.memoryTypes[(ulong)local_270 - 1].propertyFlags & 2) != 0) {
      pvVar7 = std::
               vector<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>,_std::allocator<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>_>_>
               ::operator[]((vector<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>,_std::allocator<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>_>_>
                             *)&memoryTypeNdx,
                            (ulong)memoryProperties.memoryTypes[(ulong)local_270 - 1].heapIndex);
      MemoryType::MemoryType
                ((MemoryType *)&heapInfo.field_0xc,local_270,
                 memoryProperties.memoryTypes + ((ulong)local_270 - 1));
      std::
      vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
      ::push_back(pvVar7,(value_type *)&heapInfo.field_0xc);
    }
  }
  heapInfo.flags = 0;
  do {
    if (memoryProperties.memoryTypes[0x1f].propertyFlags <= heapInfo.flags) {
      std::
      vector<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>,_std::allocator<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>_>_>
      ::~vector((vector<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>,_std::allocator<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>_>_>
                 *)&memoryTypeNdx);
      return;
    }
    heap.m_state = *(SharedPtrStateBase **)
                    &memoryProperties.memoryHeaps[(ulong)heapInfo.flags - 1].flags;
    heapInfo.size = memoryProperties.memoryHeaps[heapInfo.flags].size;
    pvVar7 = std::
             vector<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>,_std::allocator<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>_>_>
             ::operator[]((vector<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>,_std::allocator<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>_>_>
                           *)&memoryTypeNdx,(ulong)heapInfo.flags);
    bVar1 = std::
            vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
            ::empty(pvVar7);
    if (!bVar1) {
      pMVar8 = (MemoryHeap *)operator_new(0x68);
      pvVar7 = std::
               vector<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>,_std::allocator<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>_>_>
               ::operator[]((vector<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>,_std::allocator<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>_>_>
                             *)&memoryTypeNdx,(ulong)heapInfo.flags);
      MemoryHeap::MemoryHeap
                (pMVar8,(VkMemoryHeap *)&heap.m_state,pvVar7,&this->m_memoryLimits,
                 (VkDeviceSize)
                 memoryTypes.
                 super__Vector_base<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>,_std::allocator<std::vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->m_totalMemTracker);
      de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>::SharedPtr
                ((SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap> *)local_2a0,pMVar8);
      do {
        dVar3 = ::deGetFalse();
        if (dVar3 != 0) {
LAB_00bb72d5:
          this_01 = (InternalError *)__cxa_allocate_exception(0x38);
          tcu::InternalError::InternalError
                    (this_01,(char *)0x0,"!heap->full()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryMappingTests.cpp"
                     ,0x474);
          __cxa_throw(this_01,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
        }
        pMVar8 = de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>::operator->
                           ((SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap> *)local_2a0);
        bVar1 = MemoryHeap::full(pMVar8);
        if (bVar1) goto LAB_00bb72d5;
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
      std::
      vector<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>
      ::push_back(&this->m_memoryHeaps,(value_type *)local_2a0);
      de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>::~SharedPtr
                ((SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap> *)local_2a0);
    }
    heapInfo.flags = heapInfo.flags + 1;
  } while( true );
}

Assistant:

RandomMemoryMappingInstance (Context& context, deUint32 seed)
		: TestInstance				(context)
		, m_memoryObjectSysMemSize	(getMemoryObjectSystemSize(context))
		, m_memoryMappingSysMemSize	(getMemoryMappingSystemSize())
		, m_memoryLimits			(getMemoryLimits(context.getTestContext().getPlatform().getVulkanPlatform()))
		, m_rng						(seed)
		, m_opNdx					(0)
	{
		const VkPhysicalDevice					physicalDevice		= context.getPhysicalDevice();
		const InstanceInterface&				vki					= context.getInstanceInterface();
		const VkPhysicalDeviceMemoryProperties	memoryProperties	= getPhysicalDeviceMemoryProperties(vki, physicalDevice);
		// \todo [2016-05-26 misojarvi] Remove zero check once drivers report correctly 1 instead of 0
		const VkDeviceSize						nonCoherentAtomSize	= context.getDeviceProperties().limits.nonCoherentAtomSize != 0
																	? context.getDeviceProperties().limits.nonCoherentAtomSize
																	: 1;

		// Initialize heaps
		{
			vector<vector<MemoryType> >	memoryTypes	(memoryProperties.memoryHeapCount);

			for (deUint32 memoryTypeNdx = 0; memoryTypeNdx < memoryProperties.memoryTypeCount; memoryTypeNdx++)
			{
				if (memoryProperties.memoryTypes[memoryTypeNdx].propertyFlags & VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT)
					memoryTypes[memoryProperties.memoryTypes[memoryTypeNdx].heapIndex].push_back(MemoryType(memoryTypeNdx, memoryProperties.memoryTypes[memoryTypeNdx]));
			}

			for (deUint32 heapIndex = 0; heapIndex < memoryProperties.memoryHeapCount; heapIndex++)
			{
				const VkMemoryHeap	heapInfo	= memoryProperties.memoryHeaps[heapIndex];

				if (!memoryTypes[heapIndex].empty())
				{
					const de::SharedPtr<MemoryHeap>	heap	(new MemoryHeap(heapInfo, memoryTypes[heapIndex], m_memoryLimits, nonCoherentAtomSize, m_totalMemTracker));

					TCU_CHECK_INTERNAL(!heap->full());

					m_memoryHeaps.push_back(heap);
				}
			}
		}
	}